

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::base::UnixSocket::OnEvent(UnixSocket *this)

{
  State SVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  __uniq_ptr_data<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>,_true,_true>
  this_00;
  ScopedFile new_fd;
  unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_> new_sock;
  ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
  local_3c;
  unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_> local_38;
  
  SVar1 = this->state_;
  if (SVar1 == kConnecting) {
    new_sock._M_t.
    super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
    ._M_t.
    super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
    .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl._0_4_ = 0x16;
    new_fd.t_ = 4;
    iVar3 = getsockopt((this->sock_raw_).fd_.t_,1,4,&new_sock,(socklen_t *)&new_fd);
    if ((int)new_sock._M_t.
             super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
             .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl != 0x73 ||
        iVar3 != 0) {
      bVar2 = (int)new_sock._M_t.
                   super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
                   .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl == 0;
      if (iVar3 == 0 && bVar2) {
        if (this->peer_cred_mode_ == kDefault) {
          ReadPeerCredentialsPosix(this);
        }
        this->state_ = kConnected;
      }
      else {
        strerror((int)new_sock._M_t.
                      super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
                      .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl);
        Shutdown(this,false);
      }
      (*this->event_listener_->_vptr_EventListener[3])
                (this->event_listener_,this,(ulong)(iVar3 == 0 && bVar2));
    }
  }
  else {
    if (SVar1 == kConnected) {
      (*this->event_listener_->_vptr_EventListener[5])(this->event_listener_,this);
      return;
    }
    if (SVar1 == kListening) {
      do {
        while( true ) {
          iVar3 = accept((this->sock_raw_).fd_.t_,(sockaddr *)0x0,(socklen_t *)0x0);
          if (iVar3 == -1) break;
          new_fd.t_ = iVar3;
          this_00.
          super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
          ._M_t.
          super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
          .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl =
               (__uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                )operator_new(0x40);
          new_fd.t_ = -1;
          local_3c.t_ = iVar3;
          UnixSocket((UnixSocket *)
                     this_00.
                     super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
                     .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl,
                     this->event_listener_,this->task_runner_,&local_3c,kConnected,
                     (this->sock_raw_).family_,(this->sock_raw_).type_,this->peer_cred_mode_);
          new_sock._M_t.
          super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
          ._M_t.
          super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
          .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl =
               (__uniq_ptr_data<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>,_true,_true>
                )(__uniq_ptr_data<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>,_true,_true>
                  )this_00.
                   super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
                   .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl;
          ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
          ::~ScopedResource(&local_3c);
          local_38 = (unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                      )(unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                        )new_sock._M_t.
                         super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
                         .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl;
          new_sock._M_t.
          super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
          ._M_t.
          super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
          .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl =
               (__uniq_ptr_data<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>,_true,_true>
                )(__uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                  )0x0;
          (*this->event_listener_->_vptr_EventListener[2])(this->event_listener_,this,&local_38);
          std::
          unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>::
          ~unique_ptr(&local_38);
          std::
          unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>::
          ~unique_ptr(&new_sock);
          ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
          ::~ScopedResource(&new_fd);
        }
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      new_fd.t_ = -1;
      ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
      ::~ScopedResource(&new_fd);
    }
  }
  return;
}

Assistant:

void UnixSocket::OnEvent() {
  if (state_ == State::kDisconnected)
    return;  // Some spurious event, typically queued just before Shutdown().

  if (state_ == State::kConnected)
    return event_listener_->OnDataAvailable(this);

  if (state_ == State::kConnecting) {
    PERFETTO_DCHECK(sock_raw_);
    int sock_err = EINVAL;
    socklen_t err_len = sizeof(sock_err);
    int res =
        getsockopt(sock_raw_.fd(), SOL_SOCKET, SO_ERROR, &sock_err, &err_len);

    if (res == 0 && sock_err == EINPROGRESS)
      return;  // Not connected yet, just a spurious FD watch wakeup.
    if (res == 0 && sock_err == 0) {
      if (peer_cred_mode_ == SockPeerCredMode::kReadOnConnect)
        ReadPeerCredentialsPosix();
      state_ = State::kConnected;
      return event_listener_->OnConnect(this, true /* connected */);
    }
    PERFETTO_DLOG("Connection error: %s", strerror(sock_err));
    Shutdown(false);
    return event_listener_->OnConnect(this, false /* connected */);
  }

  // New incoming connection.
  if (state_ == State::kListening) {
    // There could be more than one incoming connection behind each FD watch
    // notification. Drain'em all.
    for (;;) {
      ScopedFile new_fd(
          PERFETTO_EINTR(accept(sock_raw_.fd(), nullptr, nullptr)));
      if (!new_fd)
        return;
      std::unique_ptr<UnixSocket> new_sock(new UnixSocket(
          event_listener_, task_runner_, std::move(new_fd), State::kConnected,
          sock_raw_.family(), sock_raw_.type(), peer_cred_mode_));
      event_listener_->OnNewIncomingConnection(this, std::move(new_sock));
    }
  }
}